

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

void __thiscall
DebugUtilsData::DeleteObject(DebugUtilsData *this,uint64_t object_handle,XrObjectType object_type)

{
  XrSession_T **ppXVar1;
  XrSdkSessionLabelList *pXVar2;
  XrSdkSessionLabelList *vec_ptr;
  XrSession_T *session;
  uint64_t uStack_18;
  XrObjectType object_type_local;
  uint64_t object_handle_local;
  DebugUtilsData *this_local;
  
  session._4_4_ = object_type;
  uStack_18 = object_handle;
  object_handle_local = (uint64_t)this;
  ObjectInfoCollection::RemoveObject(&this->object_info_,object_handle,object_type);
  if (session._4_4_ == XR_OBJECT_TYPE_SESSION) {
    ppXVar1 = TreatIntegerAsHandle<XrSession_T*>(&stack0xffffffffffffffe8);
    vec_ptr = (XrSdkSessionLabelList *)*ppXVar1;
    pXVar2 = GetSessionLabelList(this,(XrSession)vec_ptr);
    if (pXVar2 != (XrSdkSessionLabelList *)0x0) {
      std::
      unordered_map<XrSession_T_*,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>_>_>
      ::erase(&this->session_labels_,(key_type *)&vec_ptr);
    }
  }
  return;
}

Assistant:

void DebugUtilsData::DeleteObject(uint64_t object_handle, XrObjectType object_type) {
    object_info_.RemoveObject(object_handle, object_type);

    if (object_type == XR_OBJECT_TYPE_SESSION) {
        auto session = TreatIntegerAsHandle<XrSession>(object_handle);
        XrSdkSessionLabelList* vec_ptr = GetSessionLabelList(session);
        if (vec_ptr != nullptr) {
            session_labels_.erase(session);
        }
    }
}